

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Matrix.cpp
# Opt level: O1

Matrix __thiscall maths::Matrix::augment(Matrix *this,Matrix *A,Matrix *B)

{
  int iVar1;
  uint uVar2;
  int iVar3;
  double *pdVar4;
  double **extraout_RDX;
  double **ppdVar5;
  long lVar6;
  ulong uVar7;
  ulong uVar8;
  double **ppdVar9;
  Matrix MVar10;
  
  Matrix(this,A->rows_,B->cols_ + A->cols_);
  iVar1 = this->rows_;
  ppdVar5 = extraout_RDX;
  if (0 < (long)iVar1) {
    uVar2 = this->cols_;
    ppdVar5 = this->p;
    lVar6 = 0;
    do {
      if (0 < (int)uVar2) {
        iVar3 = A->cols_;
        pdVar4 = ppdVar5[lVar6];
        uVar7 = 0;
        do {
          if ((long)uVar7 < (long)iVar3) {
            ppdVar9 = A->p;
            uVar8 = uVar7;
          }
          else {
            uVar8 = (long)(int)uVar7 - (long)B->cols_;
            ppdVar9 = B->p;
          }
          pdVar4[uVar7] = ppdVar9[lVar6][uVar8];
          uVar7 = uVar7 + 1;
        } while (uVar7 != uVar2);
      }
      lVar6 = lVar6 + 1;
    } while (lVar6 != iVar1);
  }
  MVar10.p = ppdVar5;
  MVar10._0_8_ = this;
  return MVar10;
}

Assistant:

Matrix Matrix::augment(Matrix A, Matrix B)
{
    Matrix AB(A.rows_, A.cols_ + B.cols_);
    for (int i = 0; i < AB.rows_; ++i) {
        for (int j = 0; j < AB.cols_; ++j) {
            if (j < A.cols_)
                AB(i, j) = A(i, j);
            else
                AB(i, j) = B(i, j - B.cols_);
        }
    }
    return AB;
}